

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O0

void __thiscall
kway_min_id_heap<int,_4,_std::less<int>_>::push
          (kway_min_id_heap<int,_4,_std::less<int>_> *this,int id,key_type key)

{
  reference pvVar1;
  reference pvVar2;
  key_type in_EDX;
  int in_ESI;
  kway_min_id_heap<int,_4,_std::less<int>_> *in_RDI;
  kway_min_id_heap<int,_4,_std::less<int>_> *unaff_retaddr;
  int new_pos;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar3;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffe0;
  kway_min_id_heap<int,_4,_std::less<int>_> *pkVar4;
  int pos;
  
  pkVar4 = in_RDI;
  std::vector<bool,_std::allocator<bool>_>::operator[]
            (in_stack_ffffffffffffffe0,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
            );
  pos = (int)((ulong)pkVar4 >> 0x20);
  std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffffe0,true);
  iVar3 = in_RDI->heap_end;
  in_RDI->heap_end = in_RDI->heap_end + 1;
  pvVar1 = std::
           vector<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair,_std::allocator<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair>_>
           ::operator[](&in_RDI->heap,(long)iVar3);
  pvVar1->id = in_ESI;
  pvVar1 = std::
           vector<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair,_std::allocator<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair>_>
           ::operator[](&in_RDI->heap,(long)iVar3);
  pvVar1->key = in_EDX;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->id_pos,(long)in_ESI);
  *pvVar2 = iVar3;
  move_up(unaff_retaddr,pos);
  check_id_invariants(in_RDI);
  check_order_invariants(in_RDI);
  return;
}

Assistant:

void push(int id, key_type key)
    {
        assert(0 <= id && id < (int)id_pos.size() && "id is in range");
        assert(!contains(id) && "can not push an already existing id");

        contained_flags[id] = true;

        int new_pos = heap_end;
        ++heap_end;
        heap[new_pos].id = id;
        heap[new_pos].key = std::move(key);
        id_pos[id] = new_pos;
        move_up(new_pos);

        check_id_invariants();
        check_order_invariants();
    }